

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::NotEquals<int,int>(Assert *this,string *msg,int *expected,int *actual)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_1f0 [36];
  int local_1cc;
  expected_got_outputter<int> local_1c8 [3];
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  ostringstream local_1a8 [8];
  ostringstream s;
  int local_30;
  int local_2c;
  int *local_28;
  int *actual_local;
  int *expected_local;
  string *msg_local;
  Assert *this_local;
  
  local_2c = *expected;
  local_30 = *actual;
  local_28 = actual;
  actual_local = expected;
  expected_local = (int *)msg;
  msg_local = (string *)this;
  bVar1 = are_equal<int>(&local_2c,&local_30);
  if (!bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_1b0 = stream<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           expected_local);
    poVar3 = details::operator<<((ostream *)local_1a8,&local_1b0);
    std::operator<<(poVar3," ");
  }
  std::ostream::operator<<(local_1a8,std::boolalpha);
  poVar3 = std::operator<<((ostream *)local_1a8,"Wasn\'t expecting to get <");
  local_1cc = *local_28;
  local_1c8[0] = stream<int>(&local_1cc);
  poVar3 = details::operator<<(poVar3,local_1c8);
  std::operator<<(poVar3,">");
  std::__cxx11::ostringstream::str();
  Error(this,local_1f0);
}

Assistant:

void NotEquals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha;
                s << "Wasn't expecting to get <" << stream(std::common_type_t<T, U>(actual)) << ">";
                Error(s.str());
            }
        }